

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu541.c
# Opt level: O0

MPP_RET hal_h264e_vepu541_wait(void *hal,HalEncTask *task)

{
  MppPacket s;
  RK_S32 type_00;
  MPP_RET MVar1;
  size_t sVar2;
  HalH264eVepuStreamAmend *ctx_00;
  HalH264eVepuStreamAmend *amend;
  RK_S32 offset;
  MppPacket pkt;
  H264NaluType type;
  HalH264eVepu541Ctx *ctx;
  MPP_RET ret;
  HalEncTask *task_local;
  void *hal_local;
  
  type_00 = 1;
  if (((task->rc_task->frm).val >> 5 & 1) != 0) {
    type_00 = 5;
  }
  s = task->packet;
  sVar2 = mpp_packet_get_length(s);
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter %p\n","hal_h264e_vepu541_wait",hal);
  }
  MVar1 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),0x10,(void *)0x0);
  if (MVar1 == MPP_OK) {
    hal_h264e_vepu541_status_check(hal);
    task->hw_length = (*(uint *)((long)hal + 0x810) & 0x7ffffff) + task->hw_length;
    ctx._4_4_ = MPP_OK;
  }
  else {
    _mpp_log_l(2,"hal_h264e_vepu541","poll cmd failed %d\n","hal_h264e_vepu541_wait",
               (ulong)(uint)MVar1);
    ctx._4_4_ = MPP_ERR_VPUHW;
  }
  mpp_packet_add_segment_info(s,type_00,(RK_S32)sVar2,*(uint *)((long)hal + 0x810) & 0x7ffffff);
  ctx_00 = (HalH264eVepuStreamAmend *)((long)hal + 0x70);
  if (ctx_00->enable == 0) {
    if (*(long *)((long)hal + 0x80) != 0) {
      *(RK_S32 *)((long)hal + 0xc4) = task->hw_length;
      h264e_vepu_stream_amend_sync_ref_idc(ctx_00);
    }
  }
  else {
    *(RK_S32 *)((long)hal + 0xc4) = task->hw_length;
    *(uint *)(*(long *)((long)hal + 0x78) + 0x88) = (uint)(*(int *)(*hal + 0xe94) != 0);
    h264e_vepu_stream_amend_proc(ctx_00,(MppEncH264HwCfg *)(*hal + 0x360));
    task->hw_length = *(RK_S32 *)((long)hal + 200);
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave %p\n","hal_h264e_vepu541_wait",hal);
  }
  return ctx._4_4_;
}

Assistant:

static MPP_RET hal_h264e_vepu541_wait(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalH264eVepu541Ctx *ctx = (HalH264eVepu541Ctx *)hal;
    H264NaluType type = task->rc_task->frm.is_idr ?  H264_NALU_TYPE_IDR : H264_NALU_TYPE_SLICE;
    MppPacket pkt = task->packet;
    RK_S32 offset = mpp_packet_get_length(pkt);

    hal_h264e_dbg_func("enter %p\n", hal);

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret) {
        mpp_err_f("poll cmd failed %d\n", ret);
        ret = MPP_ERR_VPUHW;
    } else {
        hal_h264e_vepu541_status_check(hal);
        task->hw_length += ctx->regs_ret.st_bsl.bs_lgth;
    }

    mpp_packet_add_segment_info(pkt, type, offset, ctx->regs_ret.st_bsl.bs_lgth);

    {
        HalH264eVepuStreamAmend *amend = &ctx->amend;

        if (amend->enable) {
            amend->old_length = task->hw_length;
            amend->slice->is_multi_slice = (ctx->cfg->split.split_mode > 0);
            h264e_vepu_stream_amend_proc(amend, &ctx->cfg->codec.h264.hw_cfg);
            task->hw_length = amend->new_length;
        } else if (amend->prefix) {
            /* check prefix value */
            amend->old_length = task->hw_length;
            h264e_vepu_stream_amend_sync_ref_idc(amend);
        }
    }
    hal_h264e_dbg_func("leave %p\n", hal);

    return ret;
}